

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopeInfo.h
# Opt level: O3

void __thiscall Js::ScopeInfo::SetPropertyName(ScopeInfo *this,int i,PropertyRecord *name)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type *addr;
  
  if ((this->field_0x10 & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ScopeInfo.h"
                                ,0x89,"(!areNamesCached)","!areNamesCached");
    if (!bVar2) goto LAB_008a41d0;
    *puVar3 = 0;
  }
  if ((i < 0) || (this->symbolCount <= i)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ScopeInfo.h"
                                ,0x8a,"(i >= 0 && i < symbolCount)","i >= 0 && i < symbolCount");
    if (!bVar2) {
LAB_008a41d0:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  addr = &this[1].parent + (long)i * 2;
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = (ScopeInfo *)name;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  return;
}

Assistant:

void SetPropertyName(int i, PropertyRecord const* name)
        {
            Assert(!areNamesCached);
            Assert(i >= 0 && i < symbolCount);
            symbols[i].name = name;
        }